

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar32 __thiscall icu_63::Normalizer2Impl::composePair(Normalizer2Impl *this,UChar32 a,UChar32 b)

{
  uint16_t uVar1;
  uint uVar2;
  int32_t iVar3;
  UChar32 UVar4;
  uint16_t *list;
  
  uVar1 = getNorm16(this,a);
  uVar2 = (uint)uVar1;
  UVar4 = -1;
  if (uVar1 == 1) {
    return -1;
  }
  if (uVar1 < this->minYesNoMappingsOnly) {
    if (uVar1 == 2) {
      if (0x14 < b - 0x1161U) {
        return -1;
      }
      return (a * 0x15 + b) * 0x1c + -0x28469c;
    }
    if (this->minYesNo == uVar1) {
      if (0x1a < b - 0x11a8U) {
        return -1;
      }
      return a + b + -0x11a7;
    }
    list = (uint16_t *)((ulong)(uVar2 & 0xfffe) + (long)this->extraData);
    if (this->minYesNo < uVar1) {
      list = list + (ulong)(*list & 0x1f) + 1;
    }
  }
  else {
    if (0xfbff < uVar2 || uVar1 < this->minMaybeYes) {
      return -1;
    }
    list = this->maybeYesCompositions + ((int)(uVar2 - this->minMaybeYes) >> 1);
  }
  if ((uint)b < 0x110000) {
    iVar3 = combine(list,b);
    UVar4 = iVar3 >> 1;
  }
  return UVar4;
}

Assistant:

UChar32
Normalizer2Impl::composePair(UChar32 a, UChar32 b) const {
    uint16_t norm16=getNorm16(a);  // maps an out-of-range 'a' to inert norm16
    const uint16_t *list;
    if(isInert(norm16)) {
        return U_SENTINEL;
    } else if(norm16<minYesNoMappingsOnly) {
        // a combines forward.
        if(isJamoL(norm16)) {
            b-=Hangul::JAMO_V_BASE;
            if(0<=b && b<Hangul::JAMO_V_COUNT) {
                return
                    (Hangul::HANGUL_BASE+
                     ((a-Hangul::JAMO_L_BASE)*Hangul::JAMO_V_COUNT+b)*
                     Hangul::JAMO_T_COUNT);
            } else {
                return U_SENTINEL;
            }
        } else if(isHangulLV(norm16)) {
            b-=Hangul::JAMO_T_BASE;
            if(0<b && b<Hangul::JAMO_T_COUNT) {  // not b==0!
                return a+b;
            } else {
                return U_SENTINEL;
            }
        } else {
            // 'a' has a compositions list in extraData
            list=getMapping(norm16);
            if(norm16>minYesNo) {  // composite 'a' has both mapping & compositions list
                list+=  // mapping pointer
                    1+  // +1 to skip the first unit with the mapping length
                    (*list&MAPPING_LENGTH_MASK);  // + mapping length
            }
        }
    } else if(norm16<minMaybeYes || MIN_NORMAL_MAYBE_YES<=norm16) {
        return U_SENTINEL;
    } else {
        list=getCompositionsListForMaybe(norm16);
    }
    if(b<0 || 0x10ffff<b) {  // combine(list, b) requires a valid code point b
        return U_SENTINEL;
    }
#if U_SIGNED_RIGHT_SHIFT_IS_ARITHMETIC
    return combine(list, b)>>1;
#else
    int32_t compositeAndFwd=combine(list, b);
    return compositeAndFwd>=0 ? compositeAndFwd>>1 : U_SENTINEL;
#endif
}